

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  unsigned_long uVar1;
  bool bVar2;
  long lVar3;
  StringEntry *pSVar4;
  StringEntry *pSVar5;
  size_type sVar6;
  ulong uVar7;
  ostream *poVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  ulong local_360;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  string local_2f8 [32];
  cmSystemToolsRPathInfo rp [2];
  ostringstream e;
  byte abStack_210 [480];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar3 = 0xa0;
  paVar10 = &rp[0].Name.field_2;
  do {
    (((string *)(paVar10 + -1))->_M_dataplus)._M_p = (pointer)paVar10;
    *(size_type *)((long)paVar10 + -8) = 0;
    paVar10->_M_local_buf[0] = '\0';
    paVar10[1]._M_allocated_capacity = (size_type)(paVar10 + 2);
    *(undefined8 *)((long)paVar10 + 0x18) = 0;
    paVar10[2]._M_local_buf[0] = 0;
    paVar10 = paVar10 + 5;
    lVar3 = lVar3 + -0x50;
  } while (lVar3 != 0);
  cmELF::cmELF(&elf,(file->_M_dataplus)._M_p);
  se[0] = (StringEntry *)0x0;
  se[1] = (StringEntry *)0x0;
  se_name[0] = (char *)0x0;
  se_name[1] = (char *)0x0;
  pSVar4 = cmELF::GetRPath(&elf);
  if (pSVar4 != (StringEntry *)0x0) {
    se_name[0] = "RPATH";
    se[0] = pSVar4;
  }
  uVar13 = (uint)(pSVar4 != (StringEntry *)0x0);
  pSVar5 = cmELF::GetRunPath(&elf);
  if (pSVar5 == (StringEntry *)0x0) {
    if (pSVar4 != (StringEntry *)0x0) {
      local_360 = 1;
      goto LAB_00137843;
    }
    if (newRPath->_M_string_length != 0) {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::assign((char *)emsg);
        uVar13 = 0;
        std::__cxx11::string::append((string *)emsg);
        bVar2 = false;
        bVar14 = false;
        goto LAB_00137b30;
      }
      uVar13 = 0;
LAB_00137b2b:
      bVar2 = false;
      goto LAB_00137b2d;
    }
    bVar14 = true;
    uVar13 = 0;
    bVar2 = false;
  }
  else {
    uVar7 = (ulong)(uVar13 * 8);
    *(StringEntry **)((long)se + uVar7) = pSVar5;
    *(char **)((long)se_name + uVar7) = "RUNPATH";
    local_360 = (ulong)(uVar13 + 1);
LAB_00137843:
    uVar13 = 0;
    for (uVar7 = 0; local_360 != uVar7; uVar7 = uVar7 + 1) {
      if (uVar13 == 0) {
        pSVar4 = se[uVar7];
LAB_0013788c:
        sVar6 = cmSystemToolsFindRPath(&pSVar4->Value,oldRPath);
        if (sVar6 == 0xffffffffffffffff) {
          sVar6 = cmSystemToolsFindRPath(&pSVar4->Value,newRPath);
          if (sVar6 == 0xffffffffffffffff) {
            if (emsg != (string *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar8 = std::operator<<((ostream *)&e,"The current ");
              poVar8 = std::operator<<(poVar8,se_name[uVar7]);
              poVar8 = std::operator<<(poVar8," is:\n");
              poVar8 = std::operator<<(poVar8,"  ");
              poVar8 = std::operator<<(poVar8,(string *)pSVar4);
              poVar8 = std::operator<<(poVar8,"\n");
              poVar8 = std::operator<<(poVar8,"which does not contain:\n");
              poVar8 = std::operator<<(poVar8,"  ");
              poVar8 = std::operator<<(poVar8,(string *)oldRPath);
              poVar8 = std::operator<<(poVar8,"\n");
              std::operator<<(poVar8,"as was expected.");
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)emsg,local_2f8);
              std::__cxx11::string::~string(local_2f8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            }
            goto LAB_00137b2b;
          }
        }
        else {
          uVar1 = pSVar4->Size;
          rp[(int)uVar13].Position = pSVar4->Position;
          rp[(int)uVar13].Size = uVar1;
          std::__cxx11::string::assign((char *)&rp[(int)uVar13].Name);
          std::__cxx11::string::substr((ulong)&e,(ulong)pSVar4);
          this = &rp[(int)uVar13].Value;
          std::__cxx11::string::operator=((string *)this,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::append((string *)this);
          std::__cxx11::string::substr((ulong)&e,(ulong)pSVar4);
          std::__cxx11::string::append((string *)this);
          std::__cxx11::string::~string((string *)&e);
          if (rp[(int)uVar13].Size < rp[(int)uVar13].Value._M_string_length + 1) {
            if (emsg != (string *)0x0) {
              std::__cxx11::string::assign((char *)emsg);
              std::__cxx11::string::append((char *)emsg);
              std::__cxx11::string::append((char *)emsg);
            }
            goto LAB_00137b2b;
          }
          uVar13 = uVar13 + 1;
        }
      }
      else {
        pSVar4 = se[uVar7];
        if (rp[0].Position != pSVar4->Position) goto LAB_0013788c;
      }
    }
    bVar2 = true;
LAB_00137b2d:
    bVar14 = false;
  }
LAB_00137b30:
  cmELF::~cmELF(&elf);
  bVar15 = bVar14;
  if ((!bVar2) || (bVar15 = true, uVar13 == 0)) goto LAB_00137ccd;
  std::ofstream::ofstream(&e,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
  if ((abStack_210[*(long *)(_e + -0x18)] & 5) == 0) {
    uVar12 = 0;
    uVar7 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar7 = uVar12;
    }
    do {
      if (uVar12 == uVar7) {
        bVar11 = 0;
        goto LAB_00137ca6;
      }
      plVar9 = (long *)std::ostream::seekp(&e,rp[uVar12].Position,0);
      if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
        if (emsg == (string *)0x0) goto LAB_00137c9e;
        std::__cxx11::string::assign((char *)emsg);
        std::__cxx11::string::append((string *)emsg);
        goto LAB_00137c8e;
      }
      std::operator<<((ostream *)&e,(string *)&rp[uVar12].Value);
      for (sVar6 = rp[uVar12].Value._M_string_length; sVar6 < rp[uVar12].Size; sVar6 = sVar6 + 1) {
        std::operator<<((ostream *)&e,'\0');
      }
      uVar12 = uVar12 + 1;
    } while ((abStack_210[*(long *)(_e + -0x18)] & 5) == 0);
    if (emsg != (string *)0x0) {
      std::__cxx11::string::assign((char *)emsg);
      std::__cxx11::string::append((string *)emsg);
LAB_00137c8e:
      std::__cxx11::string::append((char *)emsg);
      goto LAB_00137c99;
    }
LAB_00137c9e:
    bVar11 = 1;
    bVar14 = false;
  }
  else {
    if (emsg != (string *)0x0) {
      std::__cxx11::string::assign((char *)emsg);
    }
LAB_00137c99:
    bVar11 = 1;
    bVar14 = false;
  }
LAB_00137ca6:
  std::ofstream::~ofstream(&e);
  if (changed == (bool *)0x0 || bVar11 != 0) {
    bVar15 = (bool)(bVar14 | bVar11 ^ 1);
  }
  else {
    *changed = true;
    bVar15 = true;
  }
LAB_00137ccd:
  lVar3 = 0x50;
  do {
    cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo
              ((cmSystemToolsRPathInfo *)((long)&rp[0].Position + lVar3));
    lVar3 = lVar3 + -0x50;
  } while (lVar3 != -0x50);
  return bVar15;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(changed)
    {
    *changed = false;
    }
  int rp_count = 0;
  cmSystemToolsRPathInfo rp[2];
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  const char* se_name[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count] = se_rpath;
    se_name[se_count] = "RPATH";
    ++se_count;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count] = se_runpath;
    se_name[se_count] = "RUNPATH";
    ++se_count;
    }
  if(se_count == 0)
    {
    if(newRPath.empty())
      {
      // The new rpath is empty and there is no rpath anyway so it is
      // okay.
      return true;
      }
    else
      {
      if(emsg)
        {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
        }
      return false;
      }
    }

  for(int i=0; i < se_count; ++i)
    {
    // If both RPATH and RUNPATH refer to the same string literal it
    // needs to be changed only once.
    if(rp_count && rp[0].Position == se[i]->Position)
      {
      continue;
      }

    // Make sure the current rpath contains the old rpath.
    std::string::size_type pos =
      cmSystemToolsFindRPath(se[i]->Value, oldRPath);
    if(pos == std::string::npos)
      {
      // If it contains the new rpath instead then it is okay.
      if(cmSystemToolsFindRPath(se[i]->Value, newRPath) != std::string::npos)
        {
        continue;
        }
      if(emsg)
        {
        std::ostringstream e;
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
        *emsg = e.str();
        }
      return false;
      }

    // Store information about the entry in the file.
    rp[rp_count].Position = se[i]->Position;
    rp[rp_count].Size = se[i]->Size;
    rp[rp_count].Name = se_name[i];

    // Construct the new value which preserves the part of the path
    // not being changed.
    rp[rp_count].Value = se[i]->Value.substr(0, pos);
    rp[rp_count].Value += newRPath;
    rp[rp_count].Value += se[i]->Value.substr(pos+oldRPath.length(),
                                              oldRPath.npos);

    // Make sure there is enough room to store the new rpath and at
    // least one null terminator.
    if(rp[rp_count].Size < rp[rp_count].Value.length()+1)
      {
      if(emsg)
        {
        *emsg = "The replacement path is too long for the ";
        *emsg += se_name[i];
        *emsg += " entry.";
        }
      return false;
      }

    // This entry is ready for update.
    ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if(rp_count == 0)
    {
    return true;
    }

  {
  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Store the new RPATH and RUNPATH strings.
  for(int i=0; i < rp_count; ++i)
    {
    // Seek to the RPATH position.
    if(!f.seekp(rp[i].Position))
      {
      if(emsg)
        {
        *emsg = "Error seeking to ";
        *emsg += rp[i].Name;
        *emsg += " position.";
        }
      return false;
      }

    // Write the new rpath.  Follow it with enough null terminators to
    // fill the string table entry.
    f << rp[i].Value;
    for(unsigned long j=rp[i].Value.length(); j < rp[i].Size; ++j)
      {
      f << '\0';
      }

    // Make sure it wrote correctly.
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the new ";
        *emsg += rp[i].Name;
        *emsg += " string to the file.";
        }
      return false;
      }
    }
  }

  // Everything was updated successfully.
  if(changed)
    {
    *changed = true;
    }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}